

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

EGLSurface
deqp::egl::anon_unknown_0::anon_unknown_5::createEGLSurface
          (EglTestContext *testCtx,EGLDisplay display,EGLConfig eglConfig,TestConfig *config)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  EGLSurface surface;
  EGLint attribList [5];
  Library *egl;
  TestConfig *config_local;
  EGLConfig eglConfig_local;
  EGLDisplay display_local;
  EglTestContext *testCtx_local;
  
  register0x00000000 = EglTestContext::getLibrary(testCtx);
  surface._0_4_ = 0x3057;
  surface._4_4_ = config->surfaceWidth;
  attribList[0] = 0x3056;
  attribList[1] = config->surfaceHeight;
  attribList[2] = 0x3038;
  iVar1 = (*register0x00000000->_vptr_Library[10])(register0x00000000,display,eglConfig,&surface);
  err = (*stack0xffffffffffffffd0->_vptr_Library[0x1f])();
  eglu::checkError(err,"eglCreatePbufferSurface()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                   ,0x1d8);
  return (EGLSurface)CONCAT44(extraout_var,iVar1);
}

Assistant:

EGLSurface createEGLSurface (EglTestContext& testCtx, EGLDisplay display, EGLConfig eglConfig, const TestConfig& config)
{
	const Library&	egl				= testCtx.getLibrary();
	const EGLint	attribList[]	=
	{
		EGL_WIDTH,	config.surfaceWidth,
		EGL_HEIGHT, config.surfaceHeight,
		EGL_NONE
	};

	EGLSurface surface = egl.createPbufferSurface(display, eglConfig, attribList);
	EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

	return surface;
}